

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_extract.c
# Opt level: O2

int archive_read_extract(archive *_a,archive_entry *entry,int flags)

{
  int iVar1;
  archive_read_extract *paVar2;
  archive *paVar3;
  
  paVar2 = __archive_read_get_extract((archive_read *)_a);
  if (paVar2 == (archive_read_extract *)0x0) {
    return -0x1e;
  }
  paVar3 = paVar2->ad;
  if (paVar3 == (archive *)0x0) {
    paVar3 = archive_write_disk_new();
    paVar2->ad = paVar3;
    if (paVar3 == (archive *)0x0) {
      archive_set_error(_a,0xc,"Can\'t extract");
      return -0x1e;
    }
    archive_write_disk_set_standard_lookup(paVar3);
    paVar3 = paVar2->ad;
  }
  archive_write_disk_set_options(paVar3,flags);
  iVar1 = archive_read_extract2(_a,entry,paVar2->ad);
  return iVar1;
}

Assistant:

int
archive_read_extract(struct archive *_a, struct archive_entry *entry, int flags)
{
	struct archive_read_extract *extract;
	struct archive_read * a = (struct archive_read *)_a;

	extract = __archive_read_get_extract(a);
	if (extract == NULL)
		return (ARCHIVE_FATAL);

	/* If we haven't initialized the archive_write_disk object, do it now. */
	if (extract->ad == NULL) {
		extract->ad = archive_write_disk_new();
		if (extract->ad == NULL) {
			archive_set_error(&a->archive, ENOMEM, "Can't extract");
			return (ARCHIVE_FATAL);
		}
		archive_write_disk_set_standard_lookup(extract->ad);
	}

	archive_write_disk_set_options(extract->ad, flags);
	return (archive_read_extract2(&a->archive, entry, extract->ad));
}